

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

unsigned_short anon_unknown.dwarf_254993::maxValue(Array2D<unsigned_short> *a,int nx,int ny)

{
  unsigned_short *puVar1;
  int in_EDX;
  int in_ESI;
  Array2D<unsigned_short> *in_RDI;
  int x;
  int y;
  unsigned_short mx;
  int local_1c;
  int local_18;
  unsigned_short local_12;
  
  local_12 = 0;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      puVar1 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,(long)local_18);
      if (local_12 < puVar1[local_1c]) {
        puVar1 = Imf_3_4::Array2D<unsigned_short>::operator[](in_RDI,(long)local_18);
        local_12 = puVar1[local_1c];
      }
    }
  }
  return local_12;
}

Assistant:

unsigned short
maxValue (const Array2D<unsigned short>& a, int nx, int ny)
{
    unsigned short mx = 0;

    for (int y = 0; y < ny; ++y)
        for (int x = 0; x < nx; ++x)
            if (mx < a[y][x]) mx = a[y][x];

    // cout << "max value = " << mx << endl;

    return mx;
}